

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.cpp
# Opt level: O3

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  byte bVar1;
  void *pvVar2;
  GCObject *pGVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  StkId pTVar8;
  GCObject *pGVar9;
  TValue *pTVar10;
  uint uVar11;
  char *pcVar12;
  GCObject *pGVar13;
  char *source;
  CallInfo *ci;
  long lVar14;
  byte *pbVar15;
  int local_54;
  byte *local_48;
  
  if (*what == '>') {
    pTVar8 = L->top;
    if (pTVar8[-1].tt != 6) {
      __assert_fail("(((func)->tt) == 6)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cuberite[P]lua/src/ldebug.cpp"
                    ,0xef,"int lua_getinfo(lua_State *, const char *, lua_Debug *)");
    }
    what = what + 1;
    pGVar13 = pTVar8[-1].value.gc;
    L->top = pTVar8 + -1;
    ci = (CallInfo *)0x0;
LAB_001097b9:
    if (pGVar13 != (GCObject *)0x0) {
      local_54 = 1;
      pbVar15 = (byte *)what;
      do {
        bVar1 = *pbVar15;
        if (bVar1 < 0x6c) {
          if (bVar1 < 0x53) {
            if (bVar1 != 0x4c) {
              if (bVar1 == 0) goto LAB_001099d7;
LAB_0010983a:
              local_54 = 0;
            }
          }
          else if (bVar1 == 0x53) {
            if ((pGVar13->h).flags == '\0') {
              source = (char *)&(((pGVar13->th).l_G)->grayagain->h).array;
              ar->source = source;
              iVar6 = (int)(((pGVar13->th).l_G)->buff).n;
              ar->linedefined = iVar6;
              iVar7 = *(int *)((long)&(((pGVar13->th).l_G)->buff).n + 4);
              pcVar12 = "Lua";
              if (iVar6 == 0) {
                pcVar12 = "main";
              }
            }
            else {
              source = "=[C]";
              ar->source = "=[C]";
              ar->linedefined = -1;
              iVar7 = -1;
              pcVar12 = "C";
            }
            ar->lastlinedefined = iVar7;
            ar->what = pcVar12;
            luaO_chunkid(ar->short_src,source,0x3c);
          }
          else if (bVar1 != 0x66) goto LAB_0010983a;
        }
        else if (bVar1 == 0x6c) {
          iVar6 = -1;
          if ((ci != (CallInfo *)0x0) && (uVar5 = currentpc(L,ci), -1 < (int)uVar5)) {
            pGVar9 = ((((ci->func->value).gc)->th).l_G)->rootgc;
            if (pGVar9 == (GCObject *)0x0) {
              iVar6 = 0;
            }
            else {
              iVar6 = *(int *)((long)pGVar9 + (ulong)uVar5 * 4);
            }
          }
          ar->currentline = iVar6;
        }
        else if (bVar1 == 0x6e) {
          if (((ci != (CallInfo *)0x0) &&
              (((ci->func->tt != 6 || ((((ci->func->value).gc)->h).flags != '\0')) ||
               (ci->tailcalls < 1)))) &&
             (((ci[-1].func)->tt == 6 &&
              (pGVar9 = ((ci[-1].func)->value).gc, (pGVar9->h).flags == '\0')))) {
            pvVar2 = ((pGVar9->th).l_G)->ud;
            iVar6 = currentpc(L,ci + -1);
            uVar5 = *(uint *)((long)pvVar2 + (long)iVar6 * 4);
            uVar11 = uVar5 & 0x3f;
            if ((uVar11 < 0x22) && ((0x230000000U >> uVar11 & 1) != 0)) {
              pcVar12 = getobjname(L,ci + -1,uVar5 >> 6 & 0xff,&ar->name);
              ar->namewhat = pcVar12;
              if (pcVar12 != (char *)0x0) goto LAB_001099cf;
            }
          }
          ar->namewhat = "";
          ar->name = (char *)0x0;
        }
        else {
          if (bVar1 != 0x75) goto LAB_0010983a;
          ar->nups = (uint)(pGVar13->h).lsizenode;
        }
LAB_001099cf:
        pbVar15 = pbVar15 + 1;
      } while( true );
    }
  }
  else if ((long)ar->i_ci != 0) {
    ci = L->base_ci + ar->i_ci;
    pGVar13 = (ci->func->value).gc;
    goto LAB_001097b9;
  }
  ar->namewhat = "";
  ar->name = "";
  ar->what = "tail";
  ar->currentline = -1;
  ar->linedefined = -1;
  ar->lastlinedefined = -1;
  ar->source = "=(tail call)";
  luaO_chunkid(ar->short_src,"=(tail call)",0x3c);
  ar->nups = 0;
  pcVar12 = strchr(what,0x66);
  local_48 = (byte *)what;
  if (pcVar12 == (char *)0x0) {
    bVar4 = true;
    local_54 = 1;
    pGVar13 = (GCObject *)0x0;
  }
  else {
    pTVar8 = L->top;
    pTVar8->tt = 0;
    local_54 = 1;
    bVar4 = true;
    pGVar13 = (GCObject *)0x0;
LAB_00109a89:
    if ((long)L->stack_last - (long)pTVar8 < 0x11) {
      luaD_growstack(L,1);
    }
    L->top = L->top + 1;
  }
  pcVar12 = strchr((char *)local_48,0x4c);
  if (pcVar12 == (char *)0x0) {
    return local_54;
  }
  if (!bVar4) goto LAB_00109af1;
  goto LAB_00109af7;
LAB_001099d7:
  pcVar12 = strchr(what,0x66);
  if (pcVar12 != (char *)0x0) {
    pTVar8 = L->top;
    (pTVar8->value).gc = pGVar13;
    pTVar8->tt = 6;
    pTVar8 = L->top;
    bVar4 = false;
    local_48 = (byte *)what;
    goto LAB_00109a89;
  }
  pcVar12 = strchr(what,0x4c);
  if (pcVar12 == (char *)0x0) {
    return local_54;
  }
LAB_00109af1:
  if ((pGVar13->h).flags == '\0') {
    pGVar9 = (GCObject *)luaH_new(L,0,0);
    if (0 < *(int *)((long)&((pGVar13->th).l_G)->tmudata + 4)) {
      pGVar3 = ((pGVar13->th).l_G)->rootgc;
      lVar14 = 0;
      do {
        pTVar10 = luaH_setnum(L,&pGVar9->h,*(int *)((long)pGVar3 + lVar14 * 4));
        (pTVar10->value).b = 1;
        pTVar10->tt = 1;
        lVar14 = lVar14 + 1;
      } while (lVar14 < *(int *)((long)&((pGVar13->th).l_G)->tmudata + 4));
    }
    pTVar8 = L->top;
    (pTVar8->value).gc = pGVar9;
    pTVar8->tt = 5;
    pTVar8 = L->top;
    goto LAB_00109b67;
  }
LAB_00109af7:
  pTVar8 = L->top;
  pTVar8->tt = 0;
LAB_00109b67:
  if ((long)L->stack_last - (long)pTVar8 < 0x11) {
    luaD_growstack(L,1);
    pTVar8 = L->top;
  }
  L->top = pTVar8 + 1;
  return local_54;
}

Assistant:

LUA_API int lua_getinfo (lua_State *L, const char *what, lua_Debug *ar) {
  int status;
  Closure *f = NULL;
  CallInfo *ci = NULL;
  lua_lock(L);
  if (*what == '>') {
    StkId func = L->top - 1;
    luai_apicheck(L, ttisfunction(func));
    what++;  /* skip the '>' */
    f = clvalue(func);
    L->top--;  /* pop function */
  }
  else if (ar->i_ci != 0) {  /* no tail call? */
    ci = L->base_ci + ar->i_ci;
    lua_assert(ttisfunction(ci->func));
    f = clvalue(ci->func);
  }
  status = auxgetinfo(L, what, ar, f, ci);
  if (strchr(what, 'f')) {
    if (f == NULL) setnilvalue(L->top);
    else setclvalue(L, L->top, f);
    incr_top(L);
  }
  if (strchr(what, 'L'))
    collectvalidlines(L, f);
  lua_unlock(L);
  return status;
}